

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

int glu::TextureTestUtil::computeTextureCompareDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture2DArrayView *src,float *texCoord,
              ReferenceParams *sampleParams,TexComparePrecision *comparePrec,LodPrecision *lodPrec,
              Vec3 *nonShadowThreshold)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  float *pfVar5;
  float width;
  float height;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float y_;
  float z_;
  float local_2cc;
  float local_29c;
  Vec4 local_28c;
  undefined1 local_279;
  bool isOk;
  Vec2 local_270;
  Vec2 local_268;
  Vec2 clampedLod;
  Vec2 lodO;
  Vector<float,_2> local_250;
  Vector<float,_2> local_248;
  Vec2 coordDyo;
  Vector<float,_2> local_238;
  Vector<float,_2> local_230;
  Vec2 coordDxo;
  float nyo;
  float nxo;
  float wyo;
  float wxo;
  int lodOffsNdx;
  Vec2 lodBounds;
  Vector<float,_2> local_204;
  Vector<float,_2> local_1fc;
  Vec2 coordDy;
  Vector<float,_2> local_1ec;
  Vector<float,_2> local_1e4;
  Vec2 coordDx;
  Vec3 coord;
  float triNy;
  float triNx;
  float triWy;
  float triWx;
  int triNdx;
  float ny;
  float nx;
  float wy;
  float wx;
  undefined1 local_198 [12];
  undefined1 local_18c [12];
  Vector<float,_3> local_180;
  Vector<float,_3> local_174;
  Vector<bool,_3> local_167;
  undefined1 local_164 [8];
  Vec4 refPix;
  Vec4 resPix;
  int px;
  int py;
  Vector<float,_2> local_128;
  Vec2 lodOffsets [4];
  int numFailed;
  Vec2 lodBias;
  Vec3 triW [2];
  undefined1 local_d8 [8];
  Vec3 triR [2];
  undefined1 local_b8 [8];
  Vec3 triT [2];
  undefined1 local_98 [8];
  Vec3 triS [2];
  IVec2 srcSize;
  float dstH;
  float dstW;
  IVec2 dstSize;
  Vec4 rq;
  Vec4 tq;
  Vec4 sq;
  ReferenceParams *sampleParams_local;
  float *texCoord_local;
  Texture2DArrayView *src_local;
  PixelBufferAccess *errorMask_local;
  ConstPixelBufferAccess *reference_local;
  ConstPixelBufferAccess *result_local;
  
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(tq.m_data + 2),*texCoord,texCoord[3],texCoord[6],texCoord[9]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(rq.m_data + 2),texCoord[1],texCoord[4],texCoord[7],texCoord[10]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&dstSize,texCoord[2],texCoord[5],texCoord[8],texCoord[0xb]);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(result);
  iVar3 = tcu::ConstPixelBufferAccess::getHeight(result);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&dstH,iVar2,iVar3);
  iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&dstH);
  width = (float)iVar2;
  iVar2 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&dstH);
  height = (float)iVar2;
  iVar2 = tcu::Texture2DArrayView::getWidth(src);
  iVar3 = tcu::Texture2DArrayView::getHeight(src);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)(triS[1].m_data + 1),iVar2,iVar3);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_98,(int)&tq + 8,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triS[0].m_data + 1),(int)&tq + 8,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_b8,(int)&rq + 8,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triT[0].m_data + 1),(int)&rq + 8,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_d8,(int)&dstSize,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triR[0].m_data + 1),(int)&dstSize,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&lodBias,(int)sampleParams + 0xc,0,1);
  tcu::Vector<float,_4>::swizzle
            ((Vector<float,_4> *)(triW[0].m_data + 1),(int)sampleParams + 0xc,3,2);
  if (((sampleParams->super_RenderParams).flags & 2) == 0) {
    local_29c = 0.0;
  }
  else {
    local_29c = (sampleParams->super_RenderParams).bias;
  }
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&stack0xffffffffffffff00,local_29c);
  lodOffsets[3].m_data[1] = 0.0;
  tcu::Vector<float,_2>::Vector(&local_128,-1.0,0.0);
  tcu::Vector<float,_2>::Vector(lodOffsets,1.0,0.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 1,0.0,-1.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 2,0.0,1.0);
  tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&py);
  tcu::clear(errorMask,(Vec4 *)&py);
  for (resPix.m_data[3] = 0.0; iVar2 = tcu::ConstPixelBufferAccess::getHeight(result),
      (int)resPix.m_data[3] < iVar2; resPix.m_data[3] = (float)((int)resPix.m_data[3] + 1)) {
    for (resPix.m_data[2] = 0.0; iVar2 = tcu::ConstPixelBufferAccess::getWidth(result),
        (int)resPix.m_data[2] < iVar2; resPix.m_data[2] = (float)((int)resPix.m_data[2] + 1)) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)(refPix.m_data + 2),(int)result,(int)resPix.m_data[2],
                 (int)resPix.m_data[3]);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_164,(int)reference,(int)resPix.m_data[2],
                 (int)resPix.m_data[3]);
      tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_18c,(int)local_164,1,2);
      tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_198,(int)&refPix + 8,1,2);
      tcu::operator-((tcu *)&local_180,(Vector<float,_3> *)local_18c,(Vector<float,_3> *)local_198);
      tcu::abs<float,3>((tcu *)&local_174,&local_180);
      tcu::lessThanEqual<float,3>((tcu *)&local_167,&local_174,nonShadowThreshold);
      bVar1 = tcu::boolAll<3>(&local_167);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        fVar6 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(refPix.m_data + 2));
        fVar7 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_164);
        if ((fVar6 != fVar7) || (NAN(fVar6) || NAN(fVar7))) {
          fVar8 = (float)(int)resPix.m_data[2] + 0.5;
          fVar9 = (float)(int)resPix.m_data[3] + 0.5;
          fVar10 = fVar8 / width;
          local_2cc = fVar9 / height;
          uVar4 = (uint)(1.0 <= fVar10 + local_2cc);
          fVar6 = fVar9;
          fVar7 = fVar8;
          if (uVar4 != 0) {
            fVar10 = 1.0 - fVar10;
            local_2cc = 1.0 - local_2cc;
            fVar6 = height - fVar9;
            fVar7 = width - fVar8;
          }
          fVar11 = projectedTriInterpolate
                             ((Vec3 *)(triS[(long)(int)uVar4 + -1].m_data + 1),
                              (Vec3 *)((long)&lodBias + (long)(int)uVar4 * 0xc),fVar10,local_2cc);
          y_ = projectedTriInterpolate
                         ((Vec3 *)(triT[(long)(int)uVar4 + -1].m_data + 1),
                          (Vec3 *)((long)&lodBias + (long)(int)uVar4 * 0xc),fVar10,local_2cc);
          z_ = projectedTriInterpolate
                         ((Vec3 *)(triR[(long)(int)uVar4 + -1].m_data + 1),
                          (Vec3 *)((long)&lodBias + (long)(int)uVar4 * 0xc),fVar10,local_2cc);
          tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&coordDx,fVar11,y_,z_);
          fVar11 = triDerivateX((Vec3 *)(triS[(long)(int)uVar4 + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)uVar4 * 0xc),fVar8,width,
                                local_2cc);
          fVar8 = triDerivateX((Vec3 *)(triT[(long)(int)uVar4 + -1].m_data + 1),
                               (Vec3 *)((long)&lodBias + (long)(int)uVar4 * 0xc),fVar8,width,
                               local_2cc);
          tcu::Vector<float,_2>::Vector(&local_1ec,fVar11,fVar8);
          tcu::Vector<int,_2>::asFloat((Vector<int,_2> *)&coordDy);
          tcu::operator*((tcu *)&local_1e4,&local_1ec,&coordDy);
          fVar8 = triDerivateY((Vec3 *)(triS[(long)(int)uVar4 + -1].m_data + 1),
                               (Vec3 *)((long)&lodBias + (long)(int)uVar4 * 0xc),fVar9,height,fVar10
                              );
          fVar10 = triDerivateY((Vec3 *)(triT[(long)(int)uVar4 + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)uVar4 * 0xc),fVar9,height,
                                fVar10);
          tcu::Vector<float,_2>::Vector(&local_204,fVar8,fVar10);
          tcu::Vector<int,_2>::asFloat((Vector<int,_2> *)&lodBounds);
          tcu::operator*((tcu *)&local_1fc,&local_204,&lodBounds);
          fVar10 = tcu::Vector<float,_2>::x(&local_1e4);
          fVar8 = tcu::Vector<float,_2>::y(&local_1e4);
          fVar9 = tcu::Vector<float,_2>::x(&local_1fc);
          fVar11 = tcu::Vector<float,_2>::y(&local_1fc);
          tcu::computeLodBoundsFromDerivates((tcu *)&wxo,fVar10,fVar8,fVar9,fVar11,lodPrec);
          for (wyo = 0.0; (int)wyo < 4; wyo = (float)((int)wyo + 1)) {
            fVar10 = tcu::Vector<float,_2>::x(lodOffsets + (long)(int)wyo + -1);
            fVar10 = fVar7 + fVar10;
            fVar8 = tcu::Vector<float,_2>::y(lodOffsets + (long)(int)wyo + -1);
            fVar8 = fVar6 + fVar8;
            coordDxo.m_data[1] = fVar10 / width;
            coordDxo.m_data[0] = fVar8 / height;
            fVar9 = triDerivateX((Vec3 *)(triS[(long)(int)uVar4 + -1].m_data + 1),
                                 (Vec3 *)((long)&lodBias + (long)(int)uVar4 * 0xc),fVar10,width,
                                 coordDxo.m_data[0]);
            fVar10 = triDerivateX((Vec3 *)(triT[(long)(int)uVar4 + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)uVar4 * 0xc),fVar10,width,
                                  coordDxo.m_data[0]);
            tcu::Vector<float,_2>::Vector(&local_238,fVar9,fVar10);
            tcu::Vector<int,_2>::asFloat((Vector<int,_2> *)&coordDyo);
            tcu::operator*((tcu *)&local_230,&local_238,&coordDyo);
            fVar10 = triDerivateY((Vec3 *)(triS[(long)(int)uVar4 + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)uVar4 * 0xc),fVar8,height,
                                  coordDxo.m_data[1]);
            fVar8 = triDerivateY((Vec3 *)(triT[(long)(int)uVar4 + -1].m_data + 1),
                                 (Vec3 *)((long)&lodBias + (long)(int)uVar4 * 0xc),fVar8,height,
                                 coordDxo.m_data[1]);
            tcu::Vector<float,_2>::Vector(&local_250,fVar10,fVar8);
            tcu::Vector<int,_2>::asFloat((Vector<int,_2> *)&lodO);
            tcu::operator*((tcu *)&local_248,&local_250,&lodO);
            fVar10 = tcu::Vector<float,_2>::x(&local_230);
            fVar8 = tcu::Vector<float,_2>::y(&local_230);
            fVar9 = tcu::Vector<float,_2>::x(&local_248);
            fVar11 = tcu::Vector<float,_2>::y(&local_248);
            tcu::computeLodBoundsFromDerivates((tcu *)&clampedLod,fVar10,fVar8,fVar9,fVar11,lodPrec)
            ;
            pfVar5 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&wxo);
            fVar10 = *pfVar5;
            fVar8 = tcu::Vector<float,_2>::x(&clampedLod);
            fVar10 = de::min<float>(fVar10,fVar8);
            pfVar5 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&wxo);
            *pfVar5 = fVar10;
            pfVar5 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&wxo);
            fVar10 = *pfVar5;
            fVar8 = tcu::Vector<float,_2>::y(&clampedLod);
            fVar10 = de::max<float>(fVar10,fVar8);
            pfVar5 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&wxo);
            *pfVar5 = fVar10;
          }
          tcu::operator+((tcu *)&local_270,(Vector<float,_2> *)&wxo,
                         (Vector<float,_2> *)&stack0xffffffffffffff00);
          tcu::Vector<float,_2>::Vector
                    ((Vector<float,_2> *)&stack0xfffffffffffffd88,sampleParams->minLod,
                     sampleParams->maxLod);
          tcu::clampLodBounds((tcu *)&local_268,&local_270,(Vec2 *)&stack0xfffffffffffffd88,lodPrec)
          ;
          fVar6 = (sampleParams->super_RenderParams).ref;
          fVar7 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(refPix.m_data + 2));
          local_279 = tcu::isTexCompareResultValid
                                (src,&sampleParams->sampler,comparePrec,(Vec3 *)&coordDx,&local_268,
                                 fVar6,fVar7);
          if (!(bool)local_279) {
            tcu::RGBA::red();
            tcu::RGBA::toVec((RGBA *)&local_28c);
            tcu::PixelBufferAccess::setPixel
                      (errorMask,&local_28c,(int)resPix.m_data[2],(int)resPix.m_data[3],0);
            lodOffsets[3].m_data[1] = (float)((int)lodOffsets[3].m_data[1] + 1);
          }
        }
      }
      else {
        tcu::RGBA::red();
        tcu::RGBA::toVec((RGBA *)&wx);
        tcu::PixelBufferAccess::setPixel
                  (errorMask,(Vec4 *)&wx,(int)resPix.m_data[2],(int)resPix.m_data[3],0);
        lodOffsets[3].m_data[1] = (float)((int)lodOffsets[3].m_data[1] + 1);
      }
    }
  }
  return (int)lodOffsets[3].m_data[1];
}

Assistant:

int computeTextureCompareDiff (const tcu::ConstPixelBufferAccess&	result,
							   const tcu::ConstPixelBufferAccess&	reference,
							   const tcu::PixelBufferAccess&		errorMask,
							   const tcu::Texture2DArrayView&		src,
							   const float*							texCoord,
							   const ReferenceParams&				sampleParams,
							   const tcu::TexComparePrecision&		comparePrec,
							   const tcu::LodPrecision&				lodPrec,
							   const tcu::Vec3&						nonShadowThreshold)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	const tcu::Vec4		sq				= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4		tq				= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4		rq				= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2	dstSize			= tcu::IVec2(result.getWidth(), result.getHeight());
	const float			dstW			= float(dstSize.x());
	const float			dstH			= float(dstSize.y());
	const tcu::IVec2	srcSize			= tcu::IVec2(src.getWidth(), src.getHeight());

	// Coordinates and lod per triangle.
	const tcu::Vec3		triS[2]			= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3		triT[2]			= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3		triR[2]			= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3		triW[2]			= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2		lodBias			((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int					numFailed		= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= result.getPixel(px, py);
			const tcu::Vec4	refPix	= reference.getPixel(px, py);

			// Other channels should trivially match to reference.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(refPix.swizzle(1,2,3) - resPix.swizzle(1,2,3)), nonShadowThreshold)))
			{
				errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
				numFailed += 1;
				continue;
			}

			// Reference result is known to be a valid result, we can
			// skip verification if thes results are equal
			if (resPix.x() != refPix.x())
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
				const tcu::Vec2	coordDx		= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
														triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy)) * srcSize.asFloat();
				const tcu::Vec2	coordDy		= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
														triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx)) * srcSize.asFloat();

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx.x(), coordDx.y(), coordDy.x(), coordDy.y(), lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const tcu::Vec2	coordDxo	= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
															triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo)) * srcSize.asFloat();
					const tcu::Vec2	coordDyo	= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
															triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo)) * srcSize.asFloat();
					const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo.x(), coordDxo.y(), coordDyo.x(), coordDyo.y(), lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isTexCompareResultValid(src, sampleParams.sampler, comparePrec, coord, clampedLod, sampleParams.ref, resPix.x());

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}